

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void getNameAndInt(int argc,char **argv,int *i,int part,SetAttrVector *attrs)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  char *__s;
  long lVar3;
  Attribute *pAVar4;
  invalid_argument *this;
  int j;
  allocator<char> local_7d;
  undefined4 local_7c;
  long *local_78;
  long local_70;
  long local_68 [2];
  SetAttr local_58;
  
  iVar2 = *i;
  if (iVar2 <= argc + -3) {
    __s = argv[(long)iVar2 + 1];
    lVar3 = strtol(argv[(long)iVar2 + 2],(char **)0x0,0);
    local_7c = (undefined4)lVar3;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,__s,&local_7d);
    pAVar4 = (Attribute *)operator_new(0x10);
    Imf_3_2::TypedAttribute<int>::TypedAttribute((int *)pAVar4);
    paVar1 = &local_58.name.field_2;
    local_58.name._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,local_78,local_70 + (long)local_78);
    local_58.part = part;
    local_58.attr = pAVar4;
    std::vector<SetAttr,_std::allocator<SetAttr>_>::emplace_back<SetAttr>(attrs,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.name._M_dataplus._M_p != paVar1) {
      operator_delete(local_58.name._M_dataplus._M_p,local_58.name.field_2._M_allocated_capacity + 1
                     );
    }
    if (local_78 != local_68) {
      operator_delete(local_78,local_68[0] + 1);
    }
    *i = *i + 3;
    return;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"Expected a name and an integer");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void
getNameAndInt (int argc, char** argv, int& i, int part, SetAttrVector& attrs)
{
    if (i > argc - 3)
        throw invalid_argument("Expected a name and an integer");

    const char* attrName = argv[i + 1];
    int         j        = strtol (argv[i + 2], 0, 0);
    attrs.push_back (SetAttr (attrName, part, new IntAttribute (j)));
    i += 3;
}